

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationPoints.h
# Opt level: O1

IntegrationPointList<2> *
anurbs::IntegrationPoints::get
          (IntegrationPointList<2> *__return_storage_ptr__,size_t degree_u,size_t degree_v,
          Interval *domain_u,Interval *domain_v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer ptVar4;
  tuple<double,_double> *norm_point_u;
  pointer ptVar5;
  long lVar6;
  _Head_base<0UL,_double,_false> *p_Var7;
  tuple<double,_double> *norm_point_v;
  pointer ptVar8;
  IntegrationPointList<1> integration_points_v;
  IntegrationPointList<1> integration_points_u;
  allocator_type local_51;
  IntegrationPointList<1> local_50;
  IntegrationPointList<1> local_38;
  
  get(&local_38,degree_u,domain_u);
  get(&local_50,degree_v,domain_v);
  std::
  vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>::
  vector(__return_storage_ptr__,degree_v * degree_u,&local_51);
  if (local_38.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_38.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    ptVar4 = (__return_storage_ptr__->
             super__Vector_base<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    ptVar5 = local_38.
             super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_50.
          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_50.
          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var7 = &ptVar4[lVar6].super__Tuple_impl<0UL,_double,_double,_double>.
                  super__Head_base<0UL,_double,_false>;
        ptVar8 = local_50.
                 super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          dVar1 = (ptVar5->super__Tuple_impl<0UL,_double,_double>).super__Tuple_impl<1UL,_double>.
                  super__Head_base<1UL,_double,_false>._M_head_impl;
          dVar2 = (ptVar8->super__Tuple_impl<0UL,_double,_double>).super__Tuple_impl<1UL,_double>.
                  super__Head_base<1UL,_double,_false>._M_head_impl;
          dVar3 = (ptVar8->super__Tuple_impl<0UL,_double,_double>).
                  super__Head_base<0UL,_double,_false>._M_head_impl;
          lVar6 = lVar6 + 1;
          p_Var7->_M_head_impl =
               (ptVar5->super__Tuple_impl<0UL,_double,_double>).super__Head_base<0UL,_double,_false>
               ._M_head_impl;
          ((_Head_base<1UL,_double,_false> *)(p_Var7 + -1))->_M_head_impl = dVar3;
          (((_Tuple_impl<0UL,_double,_double,_double> *)(p_Var7 + -2))->
          super__Tuple_impl<1UL,_double,_double>).super__Tuple_impl<2UL,_double>.
          super__Head_base<2UL,_double,_false> = (_Head_base<2UL,_double,_false>)(dVar1 * dVar2);
          ptVar8 = ptVar8 + 1;
          p_Var7 = p_Var7 + 3;
        } while (ptVar8 != local_50.
                           super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      ptVar5 = ptVar5 + 1;
    } while (ptVar5 != local_38.
                       super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_50.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.
      super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<2> get(const size_t degree_u,
        const size_t degree_v, const Interval& domain_u,
        const Interval& domain_v)
    {
        const auto integration_points_u = get(degree_u, domain_u);
        const auto integration_points_v = get(degree_v, domain_v);

        IntegrationPointList<2> integration_points(degree_u * degree_v);

        Index i = 0;

        for (const auto& norm_point_u : integration_points_u) {
            for (const auto& norm_point_v : integration_points_v) {
                integration_points[i++] = IntegrationPoint<2>(
                    std::get<0>(norm_point_u), std::get<0>(norm_point_v),
                    std::get<1>(norm_point_u) * std::get<1>(norm_point_v));
            }
        }

        return integration_points;
    }